

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void report_biggest_periods
               (vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *repeats,string *sequence,
               size_t max,int min_size)

{
  __normal_iterator<tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
  __last;
  pointer pRVar1;
  ostream *poVar2;
  ulong uVar3;
  difference_type __d;
  ulong uVar4;
  Repeat *pRVar5;
  __normal_iterator<tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
  _Var6;
  PrintableRepeat local_50;
  ostream_iterator<PrintableRepeat,_char,_std::char_traits<char>_> local_40;
  
  _Var6._M_current =
       (repeats->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pRVar1 = (repeats->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = ((long)pRVar1 - (long)_Var6._M_current >> 2) * -0x5555555555555555;
  if (max <= uVar4) {
    uVar4 = max;
  }
  __last._M_current = _Var6._M_current + uVar4;
  std::
  __heap_select<__gnu_cxx::__normal_iterator<tandem::Repeat*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>,__gnu_cxx::__ops::_Iter_comp_iter<PeriodGreater>>
            (_Var6._M_current,__last._M_current,pRVar1);
  std::
  __sort_heap<__gnu_cxx::__normal_iterator<tandem::Repeat*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>,__gnu_cxx::__ops::_Iter_comp_iter<PeriodGreater>>
            (_Var6,__last,(_Iter_comp_iter<PeriodGreater> *)&local_50);
  _Var6._M_current = __last._M_current;
  if (0 < min_size) {
    _Var6._M_current =
         (repeats->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
         super__Vector_impl_data._M_start;
    if (0 < (long)__last._M_current - (long)_Var6._M_current) {
      uVar4 = ((ulong)((long)__last._M_current - (long)_Var6._M_current) >> 2) * -0x5555555555555555
      ;
      do {
        uVar3 = uVar4 >> 1;
        uVar4 = ~uVar3 + uVar4;
        pRVar5 = _Var6._M_current + uVar3 + 1;
        if (_Var6._M_current[uVar3].period <= (uint)min_size) {
          uVar4 = uVar3;
          pRVar5 = _Var6._M_current;
        }
        _Var6._M_current = pRVar5;
      } while (0 < (long)uVar4);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Printing the ",0xd);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," repeats with the largest periods",0x21);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  pRVar5 = (repeats->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_40._M_stream = (ostream_type *)&std::cout;
  local_40._M_string = "\n";
  if (pRVar5 != _Var6._M_current) {
    do {
      local_50.sequence = sequence;
      local_50.repeat = pRVar5;
      std::ostream_iterator<PrintableRepeat,_char,_std::char_traits<char>_>::operator=
                (&local_40,&local_50);
      pRVar5 = pRVar5 + 1;
    } while (pRVar5 != _Var6._M_current);
  }
  return;
}

Assistant:

void report_biggest_periods(std::vector<tandem::Repeat>& repeats, const std::string& sequence,
                            const std::size_t max, const int min_size = -1)
{
    auto n = std::min(max, repeats.size());
    auto nth = std::next(std::begin(repeats), n);
    std::partial_sort(std::begin(repeats), nth, std::end(repeats), PeriodGreater {});
    if (min_size > 0) {
        nth = std::lower_bound(std::begin(repeats), nth, static_cast<std::size_t>(min_size), PeriodGreater {});
        n = std::distance(std::begin(repeats), nth);
    }
    std::clog << "Printing the " << n << " repeats with the largest periods" << std::endl;
    print(std::begin(repeats), nth, sequence);
}